

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

optional<bool> __thiscall RPCHelpMan::MaybeArg<bool>(RPCHelpMan *this,string_view key)

{
  long lVar1;
  _Optional_base<bool,_true,_true> _Var2;
  RPCHelpMan *this_00;
  RPCHelpMan *in_RSI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  size_t i;
  undefined6 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbe;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (RPCHelpMan *)GetParamIndex(in_RSI,in_stack_00000000);
  _Var2._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload<bool,_true,_true,_true>)
       ArgValue<std::optional<bool>>
                 (this_00,CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<bool,_true,_true>)
           (_Optional_base<bool,_true,_true>)_Var2._M_payload.super__Optional_payload_base<bool>;
  }
  __stack_chk_fail();
}

Assistant:

auto MaybeArg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return optional argument (without default).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value, wrapped in optional.
            return ArgValue<std::optional<R>>(i);
        } else {
            // Return other types by pointer.
            return ArgValue<const R*>(i);
        }
    }